

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

msegmentptr segment_holding(mstate m,char *addr)

{
  malloc_segment *pmVar1;
  
  pmVar1 = &m->seg;
  while ((addr < pmVar1->base || (pmVar1->base + pmVar1->size <= addr))) {
    pmVar1 = pmVar1->next;
    if (pmVar1 == (malloc_segment *)0x0) {
      return (msegmentptr)0x0;
    }
  }
  return pmVar1;
}

Assistant:

static msegmentptr segment_holding(mstate m, char* addr) {
  msegmentptr sp = &m->seg;
  for (;;) {
    if (addr >= sp->base && addr < sp->base + sp->size)
      return sp;
    if ((sp = sp->next) == 0)
      return 0;
  }
}